

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.h
# Opt level: O3

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetAggregateMarking(Aggregate_State_PDU *this,AggregateMarking *AM)

{
  undefined8 uVar1;
  undefined8 uVar2;
  KUINT8 KVar3;
  KCHAR8 KVar4;
  KCHAR8 KVar5;
  KCHAR8 KVar6;
  KCHAR8 KVar7;
  KCHAR8 KVar8;
  KCHAR8 KVar9;
  KCHAR8 KVar10;
  
  (this->m_AggregateMarking).m_sAggregateMarkingString[0x1f] = AM->m_sAggregateMarkingString[0x1f];
  KVar3 = AM->m_ui8AggregateMarkingCharacterSet;
  KVar4 = AM->m_sAggregateMarkingString[0];
  KVar5 = AM->m_sAggregateMarkingString[1];
  KVar6 = AM->m_sAggregateMarkingString[2];
  KVar7 = AM->m_sAggregateMarkingString[3];
  KVar8 = AM->m_sAggregateMarkingString[4];
  KVar9 = AM->m_sAggregateMarkingString[5];
  KVar10 = AM->m_sAggregateMarkingString[6];
  uVar1 = *(undefined8 *)(AM->m_sAggregateMarkingString + 7);
  uVar2 = *(undefined8 *)(AM->m_sAggregateMarkingString + 0x17);
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 0xf) =
       *(undefined8 *)(AM->m_sAggregateMarkingString + 0xf);
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 0x17) = uVar2;
  (this->m_AggregateMarking).m_ui8AggregateMarkingCharacterSet = KVar3;
  (this->m_AggregateMarking).m_sAggregateMarkingString[0] = KVar4;
  (this->m_AggregateMarking).m_sAggregateMarkingString[1] = KVar5;
  (this->m_AggregateMarking).m_sAggregateMarkingString[2] = KVar6;
  (this->m_AggregateMarking).m_sAggregateMarkingString[3] = KVar7;
  (this->m_AggregateMarking).m_sAggregateMarkingString[4] = KVar8;
  (this->m_AggregateMarking).m_sAggregateMarkingString[5] = KVar9;
  (this->m_AggregateMarking).m_sAggregateMarkingString[6] = KVar10;
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 7) = uVar1;
  return;
}

Assistant:

class KDIS_EXPORT AggregateMarking : public DataTypeBase
{
protected:

    KUINT8 m_ui8AggregateMarkingCharacterSet;

    KCHAR8 m_sAggregateMarkingString[32]; // Extra octet for terminator, not included in size

public:

    static const KUINT16 AGGREGATE_MARKING_SIZE = 32;

    AggregateMarking();

    explicit AggregateMarking(KDataStream &stream) noexcept(false);

    AggregateMarking(KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet MarkingCharSet, const KCHAR8 *MarkingText,
                     KUINT16 TextSize) noexcept(false);

    ~AggregateMarking() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingCharacterSet
    //              KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingCharacterSet
    // Description: Marking Char set
    // Parameter:   AggregateMarkingCharacterSet EMCS, void
    //************************************
    void SetAggregateMarkingCharacterSet( KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet EMCS );
    KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet GetAggregateMarkingCharacterSet() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingString
    //              KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingString
    // Description: Marking string. entity name etc. max 31 octets/chars
    // Parameter:   const KCHAR8 * EMS, void
    // Parameter:   KUINT16 StringSize, void
    //************************************
    void SetAggregateMarkingString( const KCHAR8 * M, KUINT16 StringSize );
    KString GetAggregateMarkingString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const AggregateMarking & Value ) const;
    KBOOL operator != ( const AggregateMarking & Value ) const;
}